

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlkf.cpp
# Opt level: O0

UObject * __thiscall
icu_63::LocaleKeyFactory::create
          (LocaleKeyFactory *this,ICUServiceKey *key,ICUService *service,UErrorCode *status)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 local_120 [8];
  Locale loc;
  int32_t kind;
  LocaleKey *lkey;
  UErrorCode *status_local;
  ICUService *service_local;
  ICUServiceKey *key_local;
  LocaleKeyFactory *this_local;
  
  iVar1 = (*(this->super_ICUServiceFactory).super_UObject._vptr_UObject[6])(this,key,status);
  if ((char)iVar1 == '\0') {
    this_local = (LocaleKeyFactory *)0x0;
  }
  else {
    loc._220_4_ = (*(key->super_UObject)._vptr_UObject[10])();
    Locale::Locale((Locale *)local_120);
    (*(key->super_UObject)._vptr_UObject[0xc])(key,(Locale *)local_120);
    iVar1 = (*(this->super_ICUServiceFactory).super_UObject._vptr_UObject[7])
                      (this,local_120,(ulong)(uint)loc._220_4_,service,status);
    this_local = (LocaleKeyFactory *)CONCAT44(extraout_var,iVar1);
    Locale::~Locale((Locale *)local_120);
  }
  return (UObject *)this_local;
}

Assistant:

UObject*
LocaleKeyFactory::create(const ICUServiceKey& key, const ICUService* service, UErrorCode& status) const {
    if (handlesKey(key, status)) {
        const LocaleKey& lkey = (const LocaleKey&)key;
        int32_t kind = lkey.kind();
        Locale loc;
        lkey.currentLocale(loc);

        return handleCreate(loc, kind, service, status);
    }
    return NULL;
}